

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

ssize_t __thiscall BloomFilter::write(BloomFilter *this,int __fd,void *__buf,size_t __n)

{
  int j;
  ssize_t sVar1;
  long lVar2;
  undefined4 in_register_00000034;
  int i;
  ulong uVar3;
  byte local_29;
  
  sVar1 = std::ostream::seekp((long)CONCAT44(in_register_00000034,__fd),0x20);
  for (uVar3 = 0; uVar3 < 0x14000; uVar3 = uVar3 + 8) {
    local_29 = 0;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      local_29 = local_29 |
                 (((this->bits).super__Base_bitset<1280UL>._M_w[lVar2 + uVar3 >> 6] >>
                   (lVar2 + uVar3 & 0x3f) & 1) != 0) << ((byte)lVar2 & 0x1f);
    }
    sVar1 = std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),(long)&local_29);
  }
  return sVar1;
}

Assistant:

void BloomFilter::write(ofstream &out) {
  out.seekp(32, std::ofstream::beg);
  for (int i = 0; i < 10240 * 8; i += 8) {
    char temp = false;
    for (int j = 0; j <= 7; j++)
      temp |=
          bits[i + j] << j;  // NOLINT(cppcoreguidelines-narrowing-conversions)
    out.write(&temp, sizeof(temp));
  }
}